

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetGlobalForceVectorAtSample
          (VClient *this,uint i_PlateID,uint i_Subsample,double (*o_rForceVector) [3])

{
  bool bVar1;
  const_reference pvVar2;
  iterator __result;
  pointer i_Translation;
  array<double,_3UL> local_f0;
  undefined1 auStack_d8 [8];
  array<double,_3UL> WorldForceVector;
  array<double,_9UL> WorldRotation;
  VForcePlateInfo *rForcePlate;
  uint local_68;
  Enum local_64;
  uint PlateIndex;
  Enum Result;
  array<double,_3UL> ForceVector;
  undefined1 local_38 [8];
  scoped_lock Lock;
  double (*o_rForceVector_local) [3];
  uint i_Subsample_local;
  uint i_PlateID_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rForceVector;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38,&this->m_FrameMutex);
  ClientUtils::Clear<double,3u>((double (*) [3])Lock._8_8_);
  local_64 = GetForceVector(this,i_PlateID,i_Subsample,(array<double,_3UL> *)&PlateIndex);
  if (local_64 == Success) {
    bVar1 = ForcePlateDeviceIndex(this,i_PlateID,&local_68);
    if (!bVar1) {
      this_local._4_4_ = Unknown;
      goto LAB_00139b66;
    }
    pvVar2 = std::
             vector<ViconCGStream::VForcePlateInfo,_std::allocator<ViconCGStream::VForcePlateInfo>_>
             ::operator[](&(this->m_LatestFrame).m_ForcePlates,(ulong)local_68);
    __result = std::array<double,_9UL>::begin((array<double,_9UL> *)(WorldForceVector._M_elems + 2))
    ;
    std::copy<float_const*,double*>(pvVar2->m_WorldRotation,pvVar2->m_Bounds,__result);
    ClientUtils::operator*
              (&local_f0,(array<double,_9UL> *)(WorldForceVector._M_elems + 2),
               (array<double,_3UL> *)&PlateIndex);
    WorldForceVector._M_elems[1] = local_f0._M_elems[2];
    auStack_d8 = (undefined1  [8])local_f0._M_elems[0];
    WorldForceVector._M_elems[0] = local_f0._M_elems[1];
    i_Translation = std::array<double,_3UL>::data((array<double,_3UL> *)auStack_d8);
    CopyAndTransformT(this,i_Translation,(double (*) [3])Lock._8_8_);
  }
  this_local._4_4_ = local_64;
LAB_00139b66:
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38);
  return this_local._4_4_;
}

Assistant:

Result::Enum VClient::GetGlobalForceVectorAtSample( const unsigned int i_PlateID,
                                            const unsigned int i_Subsample, 
                                            double ( & o_rForceVector)[3] ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Clear( o_rForceVector );

  std::array< double, 3 > ForceVector;

  Result::Enum Result = GetForceVector( i_PlateID, i_Subsample, ForceVector );

  if( Result == Result::Success )
  {
    // Get the plate index.

    unsigned int PlateIndex;
    if( !ForcePlateDeviceIndex( i_PlateID, PlateIndex ) )
    {
      return Result::Unknown;
    }

    // Transform result to global coordinates by rotating by plate orientation.

    const ViconCGStream::VForcePlateInfo & rForcePlate = m_LatestFrame.m_ForcePlates[ PlateIndex ];

    std::array< double, 3 * 3 > WorldRotation;
    std::copy( rForcePlate.m_WorldRotation, rForcePlate.m_WorldRotation + 9, WorldRotation.begin() );

    std::array< double, 3 > WorldForceVector;

    WorldForceVector = WorldRotation * ForceVector;

    CopyAndTransformT( WorldForceVector.data(), o_rForceVector );
  }

  return Result;
}